

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::SubjectSetRegister::AddSubscriptionControls
          (SubjectSetRegister *this,SubscriptionSync *subscription_sync)

{
  bool bVar1;
  int iVar2;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  *this_00;
  pointer ppVar3;
  _Rb_tree_iterator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>
  local_50;
  SubjectState *local_48;
  SubjectState *state;
  Subject *subject;
  const_iterator __end2;
  const_iterator __begin2;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  *__range2;
  uint32_t sid;
  SubscriptionSync *subscription_sync_local;
  SubjectSetRegister *this_local;
  
  __range2._4_4_ = 0;
  this_00 = SubscriptionSync::GetSubjects(subscription_sync);
  __end2 = std::
           vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
           ::begin(this_00);
  subject = (Subject *)
            std::
            vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
            ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_bidfx_public_api::price::subject::Subject_*,_std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
                                     *)&subject), bVar1) {
    state = (SubjectState *)
            __gnu_cxx::
            __normal_iterator<const_bidfx_public_api::price::subject::Subject_*,_std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
            ::operator*(&__end2);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
         ::find(&this->subject_state_,(key_type *)state);
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>
             ::operator->(&local_50);
    local_48 = &ppVar3->second;
    iVar2 = SubjectState::GetState(local_48);
    if (iVar2 == 0) {
      ClearSubjectState(this,(Subject *)state);
    }
    else {
      iVar2 = SubjectState::GetState(local_48);
      if (iVar2 == 3) {
        SubscriptionSync::AddControl(subscription_sync,__range2._4_4_,REFRESH);
      }
      else {
        iVar2 = SubjectState::GetState(local_48);
        if (iVar2 == 4) {
          SubscriptionSync::AddControl(subscription_sync,__range2._4_4_,TOGGLE);
        }
      }
    }
    SubjectState::SetState(local_48,2);
    __range2._4_4_ = __range2._4_4_ + 1;
    __gnu_cxx::
    __normal_iterator<const_bidfx_public_api::price::subject::Subject_*,_std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void SubjectSetRegister::AddSubscriptionControls(SubscriptionSync& subscription_sync)
{
    uint32_t sid = 0;

    for (const Subject& subject : subscription_sync.GetSubjects())
    {
        SubjectState& state = subject_state_.find(subject)->second;
        if (state.GetState() == STATE_UNSUBSCRIBED)
        {
            ClearSubjectState(subject);
        }
        else if (state.GetState() == STATE_REFRESH)
        {
            subscription_sync.AddControl(sid, ControlOperationEnum::REFRESH);
        }
        else if (state.GetState() == STATE_TOGGLE)
        {
            subscription_sync.AddControl(sid, ControlOperationEnum::TOGGLE);
        }
        state.SetState(STATE_SUBSCRIBED);
        sid ++;
    }
}